

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int open_get_channel_max(OPEN_HANDLE open,uint16_t *channel_max_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  undefined8 in_RAX;
  AMQP_VALUE value;
  uint32_t item_count;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  if (open == (OPEN_HANDLE)0x0) {
    return 0x55a;
  }
  iVar1 = amqpvalue_get_composite_item_count(open->composite_value,&local_14);
  if (iVar1 != 0) {
    return 0x562;
  }
  if (((3 < local_14) &&
      (value = amqpvalue_get_composite_item_in_place(open->composite_value,3),
      value != (AMQP_VALUE)0x0)) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)) {
    iVar1 = amqpvalue_get_ushort(value,channel_max_value);
    if (iVar1 == 0) {
      return 0;
    }
    AVar2 = amqpvalue_get_type(value);
    if (AVar2 != AMQP_TYPE_NULL) {
      return 0x57b;
    }
  }
  *channel_max_value = 0xffff;
  return 0;
}

Assistant:

int open_get_channel_max(OPEN_HANDLE open, uint16_t* channel_max_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        if (amqpvalue_get_composite_item_count(open_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 3)
            {
                *channel_max_value = 65535;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(open_instance->composite_value, 3);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *channel_max_value = 65535;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_ushort(item_value, channel_max_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *channel_max_value = 65535;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}